

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipartiteGraph.cpp
# Opt level: O1

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
BipartiteGraph::vertex_cover
          (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *__return_storage_ptr__,BipartiteGraph *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *Aindex,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *Bindex)

{
  double dVar1;
  int iVar2;
  size_type __n;
  pointer puVar3;
  unsigned_long uVar4;
  pointer pdVar5;
  double dVar6;
  long lVar7;
  pointer pdVar8;
  pointer pvVar9;
  BipartiteGraph *pBVar10;
  pointer pVVar11;
  pointer pVVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool *pbVar17;
  ulong uVar18;
  pointer pVVar19;
  long lVar20;
  double dVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> AScanList;
  vector<unsigned_long,_std::allocator<unsigned_long>_> BScanList;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ABflow;
  allocator_type local_131;
  BipartiteGraph *local_130;
  pointer local_128;
  pointer local_120;
  pointer local_118;
  pointer local_110;
  long local_108;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_100;
  undefined4 local_f8;
  undefined4 local_f4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_e8;
  pointer local_e0;
  pointer local_d8;
  vector<double,_std::allocator<double>_> local_d0;
  pointer local_b8;
  pointer local_b0;
  long local_a8;
  pointer local_a0;
  value_type_conflict1 local_98;
  pointer local_90;
  unsigned_long local_88;
  pointer local_80;
  pointer local_78;
  pointer local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  pointer local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_120 = (Aindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_128 = (Aindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_110 = (Bindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_118 = (Bindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  __n = this->nA;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_130 = this;
  local_100 = __return_storage_ptr__;
  local_f0 = Aindex;
  local_e8 = Bindex;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_d0,this->nB,(value_type_conflict *)&local_68,(allocator_type *)&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,__n,&local_d0,&local_131);
  if ((pointer)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d0,local_130->n,
             (value_type_conflict1 *)&local_68,(allocator_type *)&local_98);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(local_100,4,(value_type *)&local_d0,(allocator_type *)&local_131);
  if ((pointer)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pBVar10 = local_130;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d0,local_130->nA,
             (value_type_conflict1 *)&local_68,(allocator_type *)&local_98);
  local_98 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_68,pBVar10->nB,&local_98,(allocator_type *)&local_131);
  local_a8 = (long)local_128 - (long)local_120 >> 3;
  if (local_128 == local_120) {
    dVar21 = 0.0;
  }
  else {
    dVar21 = 0.0;
    lVar14 = 0;
    do {
      dVar21 = dVar21 + (local_130->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [(local_f0->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar14]].weight;
      lVar14 = lVar14 + 1;
    } while (local_a8 + (ulong)(local_a8 == 0) != lVar14);
  }
  if (local_128 != local_120) {
    puVar3 = (local_f0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pVVar11 = (local_130->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar14 = 0;
    do {
      uVar4 = puVar3[lVar14];
      pVVar11[uVar4].residual = pVVar11[uVar4].weight / dVar21;
      lVar14 = lVar14 + 1;
    } while (local_a8 + (ulong)(local_a8 == 0) != lVar14);
  }
  lVar14 = (long)local_118 - (long)local_110 >> 3;
  if (local_118 == local_110) {
    dVar21 = 0.0;
  }
  else {
    dVar21 = 0.0;
    lVar16 = 0;
    do {
      dVar21 = dVar21 + (local_130->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [(local_e8->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar16]].weight;
      lVar16 = lVar16 + 1;
    } while (lVar14 + (ulong)(lVar14 == 0) != lVar16);
  }
  if (local_118 != local_110) {
    puVar3 = (local_e8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pVVar11 = (local_130->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar16 = 0;
    do {
      uVar4 = puVar3[lVar16];
      pVVar11[uVar4].residual = pVVar11[uVar4].weight / dVar21;
      lVar16 = lVar16 + 1;
    } while (lVar14 + (ulong)(lVar14 == 0) != lVar16);
  }
  local_90 = (local_f0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_d8 = (local_130->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_e0 = (local_130->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_78 = (local_e8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_b8 = (local_100->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = local_a8 + (ulong)(local_a8 == 0);
  lVar14 = lVar14 + (ulong)(lVar14 == 0);
  local_f8 = (undefined4)CONCAT71((int7)((ulong)local_b8 >> 8),1);
  local_88 = 0;
  local_80 = local_48.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (local_128 != local_120) {
      lVar16 = 0;
      do {
        uVar4 = local_90[lVar16];
        local_d8[uVar4].label = -1.0;
        local_d8[uVar4].pred = -1;
        lVar16 = lVar16 + 1;
      } while (local_a8 != lVar16);
    }
    if (local_118 != local_110) {
      lVar16 = 0;
      pVVar11 = local_e0;
      do {
        uVar4 = local_78[lVar16];
        local_e0[uVar4].label = -1.0;
        local_e0[uVar4].pred = -1;
        pVVar11->label = -1.0;
        lVar16 = lVar16 + 1;
        pVVar11 = pVVar11 + 1;
      } while (lVar14 != lVar16);
    }
    if (local_128 == local_120) {
      lVar16 = 0;
    }
    else {
      lVar16 = 0;
      lVar15 = 0;
      do {
        dVar21 = (double)local_90[lVar15];
        if (local_d8[(long)dVar21].residual <= 0.0) {
          local_d8[(long)dVar21].label = -1.0;
        }
        else {
          local_d8[(long)dVar21].label = local_d8[(long)dVar21].residual;
          local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar16] = dVar21;
          lVar16 = lVar16 + 1;
        }
        lVar15 = lVar15 + 1;
      } while (local_a8 != lVar15);
    }
    if (lVar16 == 0) {
      dVar21 = 0.0;
    }
    else {
      local_70 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_b0 = (local_130->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                 super__Vector_impl_data._M_start;
      dVar21 = 0.0;
      local_f4 = (undefined4)CONCAT71((int7)((ulong)local_b0 >> 8),1);
      do {
        pdVar5 = (local_130->edge).
                 super__Vector_base<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (local_e8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_108 = lVar16 + (ulong)(lVar16 == 0);
        lVar15 = 0;
        lVar16 = 0;
        do {
          if (local_118 != local_110) {
            local_a0 = (local_130->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pVVar11 = (local_130->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            local_50 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            lVar20 = 0;
            do {
              dVar6 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar16];
              uVar4 = puVar3[lVar20];
              lVar7 = (long)((iterator *)
                            ((long)&pdVar5[(long)dVar6].
                                    super__Deque_base<bool,_std::allocator<bool>_>._M_impl + 0x10))
                            ->_M_cur;
              uVar13 = (lVar7 - (long)*(_Elt_pointer *)
                                       ((long)&pdVar5[(long)dVar6].
                                               super__Deque_base<bool,_std::allocator<bool>_>.
                                               _M_impl + 0x18)) + uVar4;
              if (uVar13 < 0x200) {
                pbVar17 = (bool *)(lVar7 + uVar4);
              }
              else {
                uVar18 = uVar13 >> 9 | 0xff80000000000000;
                if (0 < (long)uVar13) {
                  uVar18 = uVar13 >> 9;
                }
                pbVar17 = (*(_Map_pointer *)
                            ((long)&pdVar5[(long)dVar6].
                                    super__Deque_base<bool,_std::allocator<bool>_>._M_impl + 0x28))
                          [uVar18] + uVar13 + uVar18 * -0x200;
              }
              if (*pbVar17 == true) {
                dVar1 = pVVar11[uVar4].label;
                if ((dVar1 == -1.0) && (!NAN(dVar1))) {
                  pVVar19 = pVVar11 + uVar4;
                  pVVar19->label = local_a0[(long)dVar6].label;
                  pVVar19->pred = SUB84(dVar6,0);
                  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar15] = uVar4;
                  lVar15 = lVar15 + 1;
                }
              }
              lVar20 = lVar20 + 1;
            } while (lVar14 != lVar20);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != local_108);
        if (lVar15 == 0) {
          lVar16 = 0;
        }
        else {
          puVar3 = (local_f0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar5 = (local_130->edge).
                   super__Vector_base<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_108 = 0;
          lVar20 = 0;
          do {
            uVar4 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar20];
            dVar6 = local_b0[uVar4].residual;
            if (0.0 < dVar6) {
              pVVar11 = local_b0 + uVar4;
              dVar21 = (&pVVar11->label)
                       [(ulong)(dVar6 < pVVar11->label || dVar6 == pVVar11->label) * 2];
              local_f8 = 0;
              local_f4 = 0;
              lVar16 = local_108;
              local_88 = uVar4;
              break;
            }
            if (local_128 != local_120) {
              pVVar11 = (local_130->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              local_a0 = (pointer)local_d0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
              lVar16 = 0;
              do {
                dVar6 = (double)puVar3[lVar16];
                uVar4 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar20];
                lVar7 = (long)((iterator *)
                              ((long)&pdVar5[(long)dVar6].
                                      super__Deque_base<bool,_std::allocator<bool>_>._M_impl + 0x10)
                              )->_M_cur;
                uVar13 = (lVar7 - (long)*(_Elt_pointer *)
                                         ((long)&pdVar5[(long)dVar6].
                                                 super__Deque_base<bool,_std::allocator<bool>_>.
                                                 _M_impl + 0x18)) + uVar4;
                if (uVar13 < 0x200) {
                  pbVar17 = (bool *)(lVar7 + uVar4);
                }
                else {
                  uVar18 = uVar13 >> 9 | 0xff80000000000000;
                  if (0 < (long)uVar13) {
                    uVar18 = uVar13 >> 9;
                  }
                  pbVar17 = (*(_Map_pointer *)
                              ((long)&pdVar5[(long)dVar6].
                                      super__Deque_base<bool,_std::allocator<bool>_>._M_impl + 0x28)
                            )[uVar18] + uVar13 + uVar18 * -0x200;
                }
                if (*pbVar17 == true) {
                  dVar1 = pVVar11[(long)dVar6].label;
                  if ((dVar1 == -1.0) && (!NAN(dVar1))) {
                    pdVar8 = local_48.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)dVar6].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    dVar1 = pdVar8[uVar4];
                    if (0.0 < dVar1) {
                      pVVar12 = pVVar11 + (long)dVar6;
                      pVVar19 = local_b0 + uVar4;
                      if (dVar1 < local_b0[uVar4].label) {
                        pVVar19 = (pointer)(pdVar8 + uVar4);
                      }
                      pVVar12->label = pVVar19->label;
                      pVVar12->pred = (int)uVar4;
                      local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[local_108] = dVar6;
                      local_108 = local_108 + 1;
                    }
                  }
                }
                lVar16 = lVar16 + 1;
              } while (local_a8 != lVar16);
            }
            lVar20 = lVar20 + 1;
            lVar16 = local_108;
          } while (lVar20 != lVar15);
        }
      } while ((lVar16 != 0) && ((char)local_f4 != '\0'));
    }
    if (dVar21 <= 0.0) {
      if (local_128 == local_120) {
        lVar16 = 0;
      }
      else {
        pvVar9 = (local_100->
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar16 = 0;
        lVar15 = 0;
        do {
          if ((local_d8[local_90[lVar15]].label == -1.0) && (!NAN(local_d8[local_90[lVar15]].label))
             ) {
            *(unsigned_long *)
             (*(long *)&pvVar9[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data + lVar16 * 8) = local_90[lVar15];
            lVar16 = lVar16 + 1;
          }
          lVar15 = lVar15 + 1;
        } while (local_a8 != lVar15);
      }
      **(long **)&(local_b8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data = lVar16;
      if (local_118 == local_110) {
        lVar16 = 0;
      }
      else {
        lVar16 = 0;
        lVar15 = 0;
        do {
          if (0.0 <= local_e0[local_78[lVar15]].label) {
            *(unsigned_long *)
             (*(long *)&local_b8[3].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + lVar16 * 8) = local_78[lVar15];
            lVar16 = lVar16 + 1;
          }
          lVar15 = lVar15 + 1;
        } while (lVar14 != lVar15);
      }
      **(long **)&local_b8[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data = lVar16;
    }
    else if ((char)local_f8 == '\0') {
      local_e0[local_88].residual = local_e0[local_88].residual - dVar21;
      lVar16 = (long)local_e0[local_88].pred;
      pdVar8 = local_48.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar16].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar8[local_88] = pdVar8[local_88] + dVar21;
      while (iVar2 = local_d8[lVar16].pred, iVar2 != -1) {
        pdVar8 = local_48.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar16].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar8[iVar2] = pdVar8[iVar2] - dVar21;
        lVar16 = (long)local_e0[iVar2].pred;
        pdVar8 = local_48.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar16].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar8[iVar2] = pdVar8[iVar2] + dVar21;
      }
      local_d8[lVar16].residual = local_d8[lVar16].residual - dVar21;
    }
    if (dVar21 <= 0.0) {
      if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_48);
      return local_100;
    }
  } while( true );
}

Assistant:

vector<vector<size_t>> BipartiteGraph::vertex_cover(const vector<size_t>& Aindex, const vector<size_t>& Bindex) {
    size_t nAVC = Aindex.size(), nBVC = Bindex.size(); //nAVC,nBVC=size of A and B
    double total = 0;
    vector<vector<double>> ABflow(nA, vector<double>(nB, 0.0));
    size_t i=0, j=0, k=0, AScanListSize=0, BScanListSize=0, augmentingPathEnd=0, Apathnode=0, Bpathnode=0;
    bool augmentingPathEndMINUS1 = true;
    vector<vector<size_t>> CD(4, vector<size_t>(this->n, 0)); //output: incidence vectors of vertex covers, CD[0]=Aside; CD[1]=Bside;
    vector<size_t> AScanList(nA, 0);
    vector<size_t> BScanList(nB, 0);

    /* First set normalized weights */
    total = 0;
    for (i = 0; i < nAVC; i++)
        total += this->Avertex[Aindex[i]].weight;
    for (i = 0; i < nAVC; i++)
        this->Avertex[Aindex[i]].residual = this->Avertex[Aindex[i]].weight / total;

    total = 0;
    for (j = 0; j < nBVC; j++)
        total += this->Bvertex[Bindex[j]].weight;
    for (j = 0; j < nBVC; j++)
        this->Bvertex[Bindex[j]].residual = this->Bvertex[Bindex[j]].weight / total;

    /* Now comes the flow algorithm
     * Flow on outside arcs are represented by Vertex[i].residual
     * Flow on inside arcs are represented by ABflow
     * Initialize ABflow to 0, start scanlist
     */

    total = 1; //flow augmentation in last stage
    while (total > 0) {
        //Scan Phase
        //Set labels
        total = 0;
        for (i = 0; i < nAVC; i++) {
            Avertex[Aindex[i]].label = -1;
            Avertex[Aindex[i]].pred = -1;
        }
        for (j = 0; j < nBVC; j++) {
            Bvertex[Bindex[j]].label = -1;
            Bvertex[Bindex[j]].pred = -1;
            Bvertex[j].label = -1;
        }
        AScanListSize = 0;
        for (i = 0; i < nAVC; i++) {
            if (Avertex[Aindex[i]].residual > 0) {
                Avertex[Aindex[i]].label = Avertex[Aindex[i]].residual;
                AScanList[AScanListSize] = Aindex[i];
                AScanListSize++;
            }
            else {
                Avertex[Aindex[i]].label = -1;
            }
        }
//        for (i = 0; i < nBVC; i++) {
//            Bvertex[i].label = -1;
//        }

        // scan for an augmenting path
        bool scanning = true;
        while (AScanListSize != 0 && scanning) {
            /* Scan the A side nodes*/
            BScanListSize = 0;
            for (i = 0; i < AScanListSize; i++) {
                for (j = 0; j < nBVC; j++) {
                    if (edge[AScanList[i]][Bindex[j]] && Bvertex[Bindex[j]].label == -1) {
                        Bvertex[Bindex[j]].label = Avertex[AScanList[i]].label;
                        Bvertex[Bindex[j]].pred = AScanList[i];
                        BScanList[BScanListSize] = Bindex[j];
                        BScanListSize++;
                    }
                }
            }
            /* Scan the B side nodes*/
            AScanListSize = 0;
            for (j = 0; j < BScanListSize; j++) {
                if (Bvertex[BScanList[j]].residual > 0) {
                    total = min(Bvertex[BScanList[j]].residual, Bvertex[BScanList[j]].label);
                    augmentingPathEnd = BScanList[j];
                    augmentingPathEndMINUS1 = false;
                    scanning = false;
                    break;
                } else {
                    for (i = 0; i < nAVC; i++) {
                        if (edge[Aindex[i]][BScanList[j]] && Avertex[Aindex[i]].label == -1 && ABflow[Aindex[i]][BScanList[j]] > 0) {
                            Avertex[Aindex[i]].label = min(Bvertex[BScanList[j]].label, ABflow[Aindex[i]][BScanList[j]]);
                            Avertex[Aindex[i]].pred = BScanList[j];
                            AScanList[AScanListSize] = Aindex[i];
                            AScanListSize++;
                        }
                    }
                }
            }
        }//scanning procedure

        if (total > 0) { // flow augmentation
            if (!augmentingPathEndMINUS1) {
                Bvertex[augmentingPathEnd].residual = Bvertex[augmentingPathEnd].residual - total;
                Bpathnode = augmentingPathEnd;
                Apathnode = Bvertex[Bpathnode].pred;

                ABflow[Apathnode][Bpathnode] = ABflow[Apathnode][Bpathnode] + total;
                while (Avertex[Apathnode].pred != -1) {
                    Bpathnode = Avertex[Apathnode].pred;
                    ABflow[Apathnode][Bpathnode] = ABflow[Apathnode][Bpathnode] - total;
                    Apathnode = Bvertex[Bpathnode].pred;
                    ABflow[Apathnode][Bpathnode] = ABflow[Apathnode][Bpathnode] + total;

                }
                Avertex[Apathnode].residual = Avertex[Apathnode].residual - total;
            }
        } else { //min vertex cover found, unlabeled A's, labeled B's
            k = 0;
            for (i = 0; i < nAVC; i++)
                if (Avertex[Aindex[i]].label == -1) {
                    CD[2][k] = Aindex[i];
                    k++;
                }
            CD[0][0] = k;
            k = 0;
            for (j = 0; j < nBVC; j++)
                if (Bvertex[Bindex[j]].label >= 0) {
                    CD[3][k] = Bindex[j];
                    k++;
                }
            CD[1][0] = k;
        }
    }//flow algorithm
    return CD;

}